

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_fetch_stream_start(yaml_parser_t *parser)

{
  yaml_simple_key_t *__dest;
  yaml_token_t *__dest_00;
  int iVar1;
  undefined4 local_90 [2];
  yaml_token_t token;
  yaml_simple_key_t simple_key;
  yaml_parser_t *parser_local;
  
  memset(&token.end_mark.column,0,0x28);
  parser->indent = -1;
  if (((parser->simple_keys).top == (parser->simple_keys).end) &&
     (iVar1 = yaml_stack_extend(&(parser->simple_keys).start,&(parser->simple_keys).top,
                                &(parser->simple_keys).end), iVar1 == 0)) {
    parser->error = YAML_MEMORY_ERROR;
    parser_local._4_4_ = 0;
  }
  else {
    __dest = (parser->simple_keys).top;
    (parser->simple_keys).top = __dest + 1;
    memcpy(__dest,&token.end_mark.column,0x28);
    parser->simple_key_allowed = 1;
    parser->stream_start_produced = 1;
    memset(local_90,0,0x50);
    local_90[0] = 1;
    token.data._16_8_ = (parser->mark).index;
    token.start_mark.index = (parser->mark).line;
    token.start_mark.line = (parser->mark).column;
    token.start_mark.column = (parser->mark).index;
    token.end_mark.index = (parser->mark).line;
    token.end_mark.line = (parser->mark).column;
    token.type = parser->encoding;
    if (((parser->tokens).tail == (parser->tokens).end) &&
       (iVar1 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,
                                  &(parser->tokens).tail,&(parser->tokens).end), iVar1 == 0)) {
      parser->error = YAML_MEMORY_ERROR;
      parser_local._4_4_ = 0;
    }
    else {
      __dest_00 = (parser->tokens).tail;
      (parser->tokens).tail = __dest_00 + 1;
      memcpy(__dest_00,local_90,0x50);
      parser_local._4_4_ = 1;
    }
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_fetch_stream_start(yaml_parser_t *parser)
{
    yaml_simple_key_t simple_key = { 0, 0, 0, { 0, 0, 0 } };
    yaml_token_t token;

    /* Set the initial indentation. */

    parser->indent = -1;

    /* Initialize the simple key stack. */

    if (!PUSH(parser, parser->simple_keys, simple_key))
        return 0;

    /* A simple key is allowed at the beginning of the stream. */

    parser->simple_key_allowed = 1;

    /* We have started. */

    parser->stream_start_produced = 1;

    /* Create the STREAM-START token and append it to the queue. */

    STREAM_START_TOKEN_INIT(token, parser->encoding,
            parser->mark, parser->mark);

    if (!ENQUEUE(parser, parser->tokens, token))
        return 0;

    return 1;
}